

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::yieldUntilWouldSleep::YieldUntilWouldSleepPromiseNode::~YieldUntilWouldSleepPromiseNode
          (YieldUntilWouldSleepPromiseNode *this)

{
  YieldUntilWouldSleepPromiseNode *this_local;
  
  kj::_::PromiseNode::~PromiseNode(&this->super_PromiseNode);
  return;
}

Assistant:

Promise<void> yieldUntilWouldSleep() {
  class YieldUntilWouldSleepPromiseNode final: public _::PromiseNode {
  public:
    void destroy() override {}

    void onReady(_::Event* event) noexcept override {
      if (event) event->armWhenWouldSleep();
    }
    void get(_::ExceptionOrValue& output) noexcept override {
      output.as<_::Void>() = _::Void();
    }
    void tracePromise(_::TraceBuilder& builder, bool stopAtNextEvent) override {
      builder.add(reinterpret_cast<void*>(&kj::yieldUntilWouldSleep));
    }
  };

  static YieldUntilWouldSleepPromiseNode NODE;
  return _::PromiseNode::to<Promise<void>>(_::OwnPromiseNode(&NODE));
}